

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_beziers.cpp
# Opt level: O1

Bezier<3UL> * bezier::test::defaultCubicBezier(void)

{
  Bezier<3UL> *in_RDI;
  initializer_list<bezier::Vec2> __l;
  allocator_type local_69;
  vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> local_68;
  Vec2 local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_50.x = 120.0;
  local_50.y = 160.0;
  local_40 = 0x4041800000000000;
  local_38 = 0x4069000000000000;
  local_30 = 0x406b800000000000;
  local_28 = 0x4070400000000000;
  local_20 = 0x406b800000000000;
  local_18 = 0x4044000000000000;
  __l._M_len = 4;
  __l._M_array = &local_50;
  std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::vector(&local_68,__l,&local_69);
  Bezier<3UL>::Bezier(in_RDI,&local_68);
  if (local_68.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

bezier::Bezier<3> bezier::test::defaultCubicBezier()
{
    return ::bezier::Bezier<3>({
        {120, 160},
        {35,  200},
        {220, 260},
        {220,  40}
    });
}